

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemeq.c
# Opt level: O0

uint smemeq(void *av,void *bv,size_t len)

{
  uint local_34;
  byte *pbStack_30;
  uint val;
  uchar *b;
  uchar *a;
  size_t len_local;
  void *bv_local;
  void *av_local;
  
  local_34 = 0;
  pbStack_30 = (byte *)bv;
  b = (uchar *)av;
  a = (uchar *)len;
  while (a != (uchar *)0x0) {
    local_34 = *b ^ *pbStack_30 | local_34;
    pbStack_30 = pbStack_30 + 1;
    b = b + 1;
    a = a + -1;
  }
  return 0x100 - local_34 >> 8;
}

Assistant:

unsigned smemeq(const void *av, const void *bv, size_t len)
{
    const unsigned char *a = (const unsigned char *)av;
    const unsigned char *b = (const unsigned char *)bv;
    unsigned val = 0;

    while (len-- > 0) {
        val |= *a++ ^ *b++;
    }
    /* Now val is 0 iff we want to return 1, and in the range
     * 0x01..0xFF iff we want to return 0. So subtracting from 0x100
     * will clear bit 8 iff we want to return 0, and leave it set iff
     * we want to return 1, so then we can just shift down. */
    return (0x100 - val) >> 8;
}